

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListReader * __thiscall
capnp::_::PointerReader::getListAnySize
          (ListReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  ushort uVar1;
  StructPointerCount SVar2;
  word *pwVar3;
  CapTableReader *pCVar4;
  Arena *pAVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  WirePointer *pWVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar10;
  WirePointer *pWVar11;
  uint uVar12;
  int *piVar13;
  StructDataBitCount SVar14;
  long lVar15;
  ElementSize EVar16;
  uint uVar17;
  ulong uVar18;
  char *pcVar19;
  WirePointer *pWVar20;
  ulong uVar21;
  WirePointer *pWVar22;
  int *piVar23;
  DebugComparison<int_&,_int> *this_00;
  bool bVar24;
  Fault f;
  Exception *local_90;
  WirePointer *local_88;
  ulong local_80;
  DebugComparison<int_&,_int> _kjCondition;
  int local_4c;
  ListReader *local_48;
  Fault f_3;
  
  pWVar22 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar22 = this->pointer;
  }
  local_90 = (Exception *)this->segment;
  local_4c = this->nestingLimit;
  pWVar11 = pWVar22 + 1;
  lVar15 = (long)((int)*(uint64_t *)&(pWVar22->offsetAndKind).value >> 2);
  if (local_90 == (Exception *)0x0) {
    pWVar9 = pWVar11 + lVar15;
  }
  else {
    pwVar3 = ((ArrayPtr<const_capnp::word> *)&(local_90->ownFile).content.disposer)->ptr;
    pWVar9 = (WirePointer *)(pwVar3 + (long)local_90->file);
    if (((long)pwVar3 - (long)pWVar11 >> 3 <= lVar15) &&
       (lVar15 <= (long)pWVar9 - (long)pWVar11 >> 3)) {
      pWVar9 = pWVar11 + lVar15;
    }
  }
  pCVar4 = this->capTable;
  pWVar11 = (WirePointer *)defaultValue;
  local_48 = __return_storage_ptr__;
  if ((pWVar22->field_1).upper32Bits != 0 || (int)*(uint64_t *)&(pWVar22->offsetAndKind).value != 0)
  goto LAB_00191673;
  do {
    while( true ) {
      if ((pWVar11 == (WirePointer *)0x0) ||
         (iVar8 = (int)*(uint64_t *)&(pWVar11->offsetAndKind).value,
         (pWVar11->field_1).upper32Bits == 0 && iVar8 == 0)) {
        local_48->ptr = (byte *)0x0;
        local_48->elementCount = 0;
        local_48->step = 0;
        local_48->segment = (SegmentReader *)0x0;
        local_48->capTable = (CapTableReader *)0x0;
        *(undefined8 *)((long)&local_48->step + 3) = 0;
        local_48->nestingLimit = 0x7fffffff;
        return local_48;
      }
      local_90 = (Exception *)0x0;
      pWVar9 = pWVar11 + (long)(iVar8 >> 2) + 1;
      defaultValue = (word *)0x0;
      pWVar22 = pWVar11;
LAB_00191673:
      _kjCondition.left = &local_4c;
      _kjCondition._8_8_ = (ulong)(uint)_kjCondition._12_4_ << 0x20;
      _kjCondition.op.content.ptr = " > ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = 0 < local_4c;
      pWVar11 = (WirePointer *)defaultValue;
      if (0 < local_4c) break;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<int&,int>&,char_const(&)[76]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8e6,FAILED,"nestingLimit > 0",
                 "_kjCondition,\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\""
                 ,&_kjCondition,
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
      kj::_::Debug::Fault::~Fault(&f);
    }
    pWVar20 = pWVar22;
    if ((local_90 != (Exception *)0x0) && ((*(uint64_t *)&(pWVar22->offsetAndKind).value & 3) == 2))
    {
      pAVar5 = (Arena *)(local_90->ownFile).content.ptr;
      iVar8 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)(pWVar22->field_1).upper32Bits);
      local_90 = (Exception *)CONCAT44(extraout_var,iVar8);
      _kjCondition.left = (int *)&local_90;
      _kjCondition.right = 0;
      _kjCondition._12_4_ = 0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = local_90 != (Exception *)0x0;
      if (_kjCondition.result) {
        uVar17 = (uint)*(uint64_t *)&(pWVar22->offsetAndKind).value;
        pcVar10 = (char *)(ulong)(uVar17 >> 3);
        pcVar19 = local_90->file;
        if ((long)pcVar19 < (long)pcVar10) {
          pcVar10 = pcVar19;
        }
        pWVar20 = (WirePointer *)
                  (((ArrayPtr<const_capnp::word> *)&(local_90->ownFile).content.disposer)->ptr +
                  (long)pcVar10);
        if (local_90 == (Exception *)0x0) {
          f.exception._0_1_ = 1;
LAB_00191d9a:
          if ((*(uint64_t *)&(pWVar22->offsetAndKind).value & 4) == 0) {
            pWVar22 = pWVar20 + 1;
            lVar15 = (long)((int)*(uint64_t *)&(pWVar20->offsetAndKind).value >> 2);
            if (local_90 == (Exception *)0x0) {
              pWVar9 = pWVar22 + lVar15;
            }
            else {
              pwVar3 = ((ArrayPtr<const_capnp::word> *)&(local_90->ownFile).content.disposer)->ptr;
              pWVar9 = (WirePointer *)(pwVar3 + (long)local_90->file);
              if (((long)pwVar3 - (long)pWVar22 >> 3 <= lVar15) &&
                 (lVar15 <= (long)pWVar9 - (long)pWVar22 >> 3)) {
                pWVar9 = pWVar22 + lVar15;
              }
            }
            goto LAB_001917b0;
          }
          pWVar22 = pWVar20 + 1;
          pAVar5 = (Arena *)(local_90->ownFile).content.ptr;
          iVar8 = (*pAVar5->_vptr_Arena[2])(pAVar5,(ulong)(pWVar20->field_1).upper32Bits);
          f.exception = (Exception *)CONCAT44(extraout_var_00,iVar8);
          _kjCondition.right = 0;
          _kjCondition._12_4_ = 0;
          _kjCondition.op.content.ptr = " != ";
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = f.exception != (Exception *)0x0;
          if (f.exception == (Exception *)0x0) {
            this_00 = (DebugComparison<int_&,_int> *)&f_3;
            _kjCondition.left = (int *)&f;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x25f,FAILED,"newSegment != nullptr",
                       "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                       (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                       (char (*) [56])"Message contains double-far pointer to unknown segment.");
          }
          else {
            uVar17 = (uint)*(uint64_t *)&(pWVar20->offsetAndKind).value & 3;
            _kjCondition.left = (int *)CONCAT44(2,uVar17);
            _kjCondition._8_8_ = anon_var_dwarf_48f46;
            _kjCondition.op.content.ptr = (char *)0x5;
            _kjCondition.op.content.size_ = (size_t)(uVar17 == 2);
            if (uVar17 == 2) {
              pcVar19 = (char *)(ulong)((uint)*(uint64_t *)&(pWVar20->offsetAndKind).value >> 3);
              if ((long)(f.exception)->file < (long)pcVar19) {
                pcVar19 = (f.exception)->file;
              }
              pWVar9 = (WirePointer *)
                       (((ArrayPtr<const_capnp::word> *)&((f.exception)->ownFile).content.disposer)
                        ->ptr + (long)pcVar19);
              pWVar20 = pWVar22;
              local_90 = f.exception;
              goto LAB_001917b0;
            }
            this_00 = (DebugComparison<int_&,_int> *)&f_3;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                       "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                       (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                       &_kjCondition,
                       (char (*) [51])"Second word of double-far pad must be far pointer.");
          }
        }
        else {
          uVar18 = 2 - (ulong)((uVar17 & 4) == 0);
          if (pcVar19 < pcVar10 + uVar18) {
            f.exception = (Exception *)((ulong)f.exception._1_7_ << 8);
          }
          else {
            uVar21 = (*(ReadLimiter **)&local_90->line)->limit;
            if (uVar21 < uVar18) {
              (*((Arena *)(local_90->ownFile).content.ptr)->_vptr_Arena[3])();
            }
            else {
              (*(ReadLimiter **)&local_90->line)->limit = uVar21 - uVar18;
            }
            f.exception._0_1_ = uVar18 <= uVar21;
            if (uVar18 <= uVar21) goto LAB_00191d9a;
          }
          this_00 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                    ((Fault *)this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                     "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [318])
                     "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
        }
        kj::_::Debug::Fault::~Fault((Fault *)this_00);
        pWVar9 = (WirePointer *)0x0;
        pWVar20 = pWVar22;
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",
                   (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&_kjCondition,
                   (char (*) [49])"Message contains far pointer to unknown segment.");
        kj::_::Debug::Fault::~Fault(&f);
        pWVar9 = (WirePointer *)0x0;
      }
    }
LAB_001917b0:
    cVar7 = (pWVar9 == (WirePointer *)0x0) * '\x02';
    if (pWVar9 == (WirePointer *)0x0) goto LAB_00191d55;
    uVar17 = (uint)*(uint64_t *)&(pWVar20->offsetAndKind).value & 3;
    _kjCondition.left = (int *)CONCAT44(1,uVar17);
    _kjCondition._8_8_ = anon_var_dwarf_48f46;
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar17 == 1);
    local_88 = pWVar9;
    if (uVar17 == 1) {
      uVar17 = (pWVar20->field_1).upper32Bits;
      EVar16 = (ElementSize)uVar17 & INLINE_COMPOSITE;
      if (EVar16 == INLINE_COMPOSITE) {
        f_3.exception._0_4_ = uVar17 >> 3;
        bVar24 = true;
        if ((local_90 != (Exception *)0x0) &&
           (bVar24 = false,
           (char *)(((long)pWVar9 -
                     (long)((ArrayPtr<const_capnp::word> *)&(local_90->ownFile).content.disposer)->
                           ptr >> 3) + (ulong)(uint)f_3.exception + 1) <= local_90->file)) {
          uVar21 = (ulong)(uint)f_3.exception + 1;
          uVar18 = (*(ReadLimiter **)&local_90->line)->limit;
          bVar24 = uVar18 >= uVar21;
          if (uVar18 < uVar21) {
            (*((Arena *)(local_90->ownFile).content.ptr)->_vptr_Arena[3])();
          }
          else {
            (*(ReadLimiter **)&local_90->line)->limit = uVar18 - uVar21;
          }
        }
        f.exception._0_1_ = bVar24;
        if (bVar24 == false) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x900,FAILED,"boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)",
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          cVar7 = '\x02';
        }
        else {
          pWVar22 = local_88 + 1;
          uVar17 = (uint)*(uint64_t *)&(local_88->offsetAndKind).value & 3;
          _kjCondition.left = (int *)(ulong)uVar17;
          _kjCondition._8_8_ = anon_var_dwarf_48f46;
          _kjCondition.op.content.ptr = (char *)0x5;
          _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar17 == 0);
          if (uVar17 == 0) {
            uVar17 = (uint)*(uint64_t *)&(local_88->offsetAndKind).value >> 2 & 0x1fffffff;
            uVar21 = (ulong)uVar17;
            uVar18 = (ulong)((uint)(local_88->field_1).structRef.ptrCount.value +
                            (uint)(local_88->field_1).structRef.dataSize.value);
            piVar13 = (int *)(uVar18 * uVar21);
            _kjCondition._8_8_ = &f_3;
            piVar23 = (int *)(ulong)(uint)f_3.exception;
            cVar7 = '\0';
            _kjCondition.op.content.ptr = " <= ";
            _kjCondition.op.content.size_ = 5;
            bVar24 = (long)piVar13 - (long)piVar23 == 0;
            _kjCondition.result = piVar13 < piVar23 || bVar24;
            _kjCondition.left = piVar13;
            if (piVar13 >= piVar23 && !bVar24) {
              local_80 = uVar18;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount"
                         ,
                         "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\""
                         ,(DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                         (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.")
              ;
              kj::_::Debug::Fault::~Fault(&f);
              cVar7 = '\x02';
              uVar18 = local_80;
            }
            if (piVar13 < piVar23 || (long)piVar13 - (long)piVar23 == 0) {
              if ((int)uVar18 == 0) {
                bVar24 = true;
                if (local_90 != (Exception *)0x0) {
                  uVar6 = (*(ReadLimiter **)&local_90->line)->limit;
                  bVar24 = uVar6 >= uVar21;
                  if (uVar6 < uVar21) {
                    (*((Arena *)(local_90->ownFile).content.ptr)->_vptr_Arena[3])();
                  }
                  else {
                    (*(ReadLimiter **)&local_90->line)->limit = uVar6 - uVar21;
                  }
                }
                f.exception._0_1_ = bVar24;
                if (bVar24 == false) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                            ((Fault *)&_kjCondition,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x917,FAILED,"amplifiedRead(segment, size * (ONE * WORDS / ELEMENTS))"
                             ,"_kjCondition,\"Message contains amplified list pointer.\"",
                             (DebugExpression<bool> *)&f,
                             (char (*) [41])"Message contains amplified list pointer.");
                  kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
                  cVar7 = '\x02';
                  goto LAB_00191d55;
                }
              }
              uVar1 = (local_88->field_1).structRef.dataSize.value;
              SVar2 = (local_88->field_1).structRef.ptrCount.value;
              local_48->segment = (SegmentReader *)local_90;
              local_48->capTable = pCVar4;
              local_48->ptr = (byte *)pWVar22;
              local_48->elementCount = uVar17;
              local_48->step = (int)uVar18 << 6;
              local_48->structDataSize = (uint)uVar1 << 6;
              local_48->structPointerCount = SVar2;
              local_48->elementSize = INLINE_COMPOSITE;
              local_48->nestingLimit = local_4c + -1;
              cVar7 = '\x01';
            }
          }
          else {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                       "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                       ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *
                        )&_kjCondition,
                       (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported."
                      );
            kj::_::Debug::Fault::~Fault(&f);
            cVar7 = '\x02';
          }
        }
      }
      else {
        SVar14 = (&BITS_PER_ELEMENT_TABLE)[EVar16];
        uVar18 = (ulong)(uVar17 >> 3);
        uVar12 = (uint)(EVar16 == POINTER) * 0x40 + SVar14;
        bVar24 = true;
        if (local_90 != (Exception *)0x0) {
          uVar21 = uVar12 * uVar18 + 0x3f >> 6 & 0xffffffff;
          bVar24 = false;
          if ((char *)(((long)pWVar9 -
                        (long)((ArrayPtr<const_capnp::word> *)&(local_90->ownFile).content.disposer)
                              ->ptr >> 3) + uVar21) <= local_90->file) {
            uVar6 = (*(ReadLimiter **)&local_90->line)->limit;
            bVar24 = uVar6 >= uVar21;
            if (uVar6 < uVar21) {
              local_80 = CONCAT44(local_80._4_4_,SVar14);
              (*((Arena *)(local_90->ownFile).content.ptr)->_vptr_Arena[3])();
              SVar14 = (StructDataBitCount)local_80;
            }
            else {
              (*(ReadLimiter **)&local_90->line)->limit = uVar6 - uVar21;
            }
          }
        }
        f.exception._0_1_ = bVar24;
        if (bVar24 == false) {
          local_80 = CONCAT44(local_80._4_4_,SVar14);
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x958,FAILED,"boundsCheck(segment, ptr, wordCount)",
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&f,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
          goto LAB_00191d26;
        }
        if ((uVar17 & 7) == 0) {
          bVar24 = true;
          if (local_90 != (Exception *)0x0) {
            uVar21 = (*(ReadLimiter **)&local_90->line)->limit;
            bVar24 = uVar21 >= uVar18;
            if (uVar21 < uVar18) {
              local_80 = CONCAT44(local_80._4_4_,SVar14);
              (*((Arena *)(local_90->ownFile).content.ptr)->_vptr_Arena[3])();
              SVar14 = (StructDataBitCount)local_80;
            }
            else {
              (*(ReadLimiter **)&local_90->line)->limit = uVar21 - uVar18;
            }
          }
          f.exception._0_1_ = bVar24;
          if (bVar24 == false) {
            local_80 = CONCAT44(local_80._4_4_,SVar14);
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
                      ((Fault *)&_kjCondition,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x960,FAILED,
                       "amplifiedRead(segment, elementCount * (ONE * WORDS / ELEMENTS))",
                       "_kjCondition,\"Message contains amplified list pointer.\"",
                       (DebugExpression<bool> *)&f,
                       (char (*) [41])"Message contains amplified list pointer.");
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
            goto LAB_00191d26;
          }
        }
        local_48->segment = (SegmentReader *)local_90;
        local_48->capTable = pCVar4;
        local_48->ptr = (byte *)local_88;
        local_48->elementCount = uVar17 >> 3;
        local_48->step = uVar12;
        local_48->structDataSize = SVar14;
        local_48->structPointerCount = (ushort)(EVar16 == POINTER);
        local_48->elementSize = EVar16;
        local_48->nestingLimit = local_4c + -1;
        cVar7 = '\x01';
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [84])
                 "Schema mismatch: Message contains non-list pointer where list pointer was expected."
                );
      kj::_::Debug::Fault::~Fault(&f);
LAB_00191d26:
      cVar7 = '\x02';
    }
LAB_00191d55:
    if (cVar7 != '\x02') {
      return local_48;
    }
  } while( true );
}

Assistant:

ListReader PointerReader::getListAnySize(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readListPointer(
      segment, capTable, ref, defaultValue, ElementSize::VOID /* dummy */, nestingLimit, false);
}